

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O1

void demmt_nouveau_gem_pushbuf_data(mmt_nouveau_pushbuf_data *data,void *state)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = (ulong)(data->data).len;
  if (7 < uVar7) {
    uVar1 = *(uint *)(data + 1);
    uVar9 = (ulong)uVar1;
    if (uVar9 + 4 <= uVar7) {
      uVar2 = *(uint *)((long)&data[1].data.len + uVar9 + 2);
      uVar5 = (ulong)uVar2;
      uVar8 = uVar9 + uVar5 + 8;
      if (uVar8 <= uVar7) {
        uVar6 = *(uint *)((long)&data[2].data.len + uVar5 + uVar9);
        if (uVar8 + uVar6 + 4 <= uVar7) {
          uVar6 = uVar6 >> 2;
          uVar7 = (ulong)uVar6 / 7;
          if (dump_decoded_ioctl_data != 0) {
            pcVar3 = colors->reset;
            pcVar4 = colors->num;
            if (indent_logs == 0) {
              fprintf(_stdout,
                      "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                      ,colors->rname,pcVar3,pcVar4,uVar9 / 0x28,pcVar3,pcVar4,uVar7,pcVar3,pcVar4,
                      uVar5 / 0x18,pcVar3);
            }
            else {
              fprintf(_stdout,
                      "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n"
                      ," ",colors->rname,pcVar3,pcVar4,uVar9 / 0x28,pcVar3,pcVar4,uVar7,pcVar3,
                      pcVar4,uVar5 / 0x18,pcVar3);
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
          demmt_nouveau_decode_gem_pushbuf_data
                    (uVar1 / 0x28,(drm_nouveau_gem_pushbuf_bo *)((long)&data[1].data.len + 2),
                     uVar2 / 0x18,(drm_nouveau_gem_pushbuf_push *)((long)&data[2].data.len + uVar9),
                     uVar6 / 7,
                     (drm_nouveau_gem_pushbuf_reloc *)(&data[3].msg_type.msg_type + uVar5 + uVar9));
          return;
        }
      }
    }
  }
  fprintf(_stdout,"ERROR: invalid mmt_nouveau_pushbuf_data %s\n","");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  demmt_abort();
}

Assistant:

void demmt_nouveau_gem_pushbuf_data(struct mmt_nouveau_pushbuf_data *data, void *state)
{
	// compat code, mmt does not generate mmt_nouveau_pushbuf_data message anymore

	int minlen = sizeof(struct mmt_buf *);
	if (data->data.len < minlen)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}
	uint64_t used = 0;
	struct mmt_buf *buffers_mmt_buf = (void *)&data->data.data;
	used += buffers_mmt_buf->len + sizeof(*buffers_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_bo *buffers = (void *)&buffers_mmt_buf->data;
	struct mmt_buf *push_mmt_buf = ((void *)buffers) + buffers_mmt_buf->len;
	used += push_mmt_buf->len + sizeof(*push_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_push *push = (void *)&push_mmt_buf->data;
	struct mmt_buf *relocs_mmt_buf = ((void *)push) + push_mmt_buf->len;
	used += relocs_mmt_buf->len + sizeof(*relocs_mmt_buf);
	if (used > data->data.len)
	{
		mmt_error("invalid mmt_nouveau_pushbuf_data %s\n", "");
		demmt_abort();
	}

	struct drm_nouveau_gem_pushbuf_reloc *relocs = (void *)&relocs_mmt_buf->data;

	int nr_buffers = buffers_mmt_buf->len / sizeof(buffers[0]);
	int nr_push = push_mmt_buf->len / sizeof(push[0]);
	int nr_relocs = relocs_mmt_buf->len / sizeof(relocs[0]);

	if (dump_decoded_ioctl_data)
	{
		mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s data, nr_buffers: %s%d%s, nr_relocs: %s%d%s, nr_push: %s%d%s\n",
				colors->rname, colors->reset, colors->num, nr_buffers, colors->reset,
				colors->num, nr_relocs, colors->reset, colors->num, nr_push, colors->reset);
	}

	demmt_nouveau_decode_gem_pushbuf_data(nr_buffers, buffers, nr_push, push, nr_relocs, relocs);
}